

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  pointer pcVar1;
  size_type sVar2;
  cmListFileFunction *pcVar3;
  char cVar4;
  ulong uVar5;
  ostream *poVar6;
  cmListFileContext *in_RCX;
  ulong uVar7;
  pointer pcVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Internals *pIVar12;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  lVar11 = fb[10].StartingContext.Line;
  if (*(long *)((long)&fb[10].StartingContext.FilePath.field_2 + 8) == lVar11) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ulong *)(lVar11 + -8);
  }
  pcVar1 = fb[10].StartingContext.FilePath._M_dataplus._M_p;
  sVar2 = fb[10].StartingContext.FilePath._M_string_length;
  uVar9 = (long)(sVar2 - (long)pcVar1) >> 3;
  pIVar12 = (Internals *)0x0;
  uVar7 = uVar9;
  lVar11 = 0;
  do {
    lVar10 = lVar11;
    if (uVar7 <= uVar5) goto LAB_0036ba17;
    uVar7 = uVar7 - 1;
    pcVar3 = *(cmListFileFunction **)((sVar2 - 8) + lVar10);
    lVar11 = lVar10 + -8;
  } while (pcVar3 != lff);
  cVar4 = (**(code **)((pcVar3->super_cmListFileContext).Name._M_dataplus._M_p + 8))();
  if (cVar4 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar6 = operator<<((ostream *)local_1a8,
                        (cmListFileContext *)&(lff->super_cmListFileContext).Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"closes on the line\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
    poVar6 = operator<<(poVar6,in_RCX);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"with mis-matching arguments.",0x1c);
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  pcVar1 = pcVar1 + uVar9 * 8;
  pIVar12 = *(Internals **)(pcVar1 + lVar11);
  pcVar8 = (pointer)fb[10].StartingContext.FilePath._M_string_length;
  if (pcVar1 + lVar10 != pcVar8) {
    memmove(pcVar1 + lVar11,pcVar1 + lVar10,(size_t)(pcVar8 + (-lVar11 - (long)pcVar1) + -8));
    pcVar8 = (pointer)fb[10].StartingContext.FilePath._M_string_length;
  }
  fb[10].StartingContext.FilePath._M_string_length = (size_type)(pcVar8 + -8);
LAB_0036ba17:
  (this->Internal).x_ = pIVar12;
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

cmsys::auto_ptr<cmFunctionBlocker>
cmMakefile::RemoveFunctionBlocker(cmFunctionBlocker* fb,
                                  const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if(!this->FunctionBlockerBarriers.empty())
    {
    barrier = this->FunctionBlockerBarriers.back();
    }

  // Search for the function blocker whose scope this command ends.
  for(FunctionBlockersType::size_type
        i = this->FunctionBlockers.size(); i > barrier; --i)
    {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb)
      {
      // Warn if the arguments do not match, but always remove.
      if(!(*pos)->ShouldRemove(lff, *this))
        {
        cmListFileContext const& lfc = fb->GetStartingContext();
        std::ostringstream e;
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << lff << "\n"
          << "with mis-matching arguments.";
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return cmsys::auto_ptr<cmFunctionBlocker>(b);
      }
    }

  return cmsys::auto_ptr<cmFunctionBlocker>();
}